

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

Variable __thiscall
LiteScript::CreateVariable
          (LiteScript *this,Memory *memory,
          _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
          *value)

{
  Object *pOVar1;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *puVar2;
  Variable VVar3;
  allocator<LiteScript::Namer> allocator;
  new_allocator<LiteScript::Namer> local_c9;
  Callback local_c8;
  
  Memory::Create((Memory *)this,(Type *)memory);
  Callback::Callback(&local_c8,memory,value);
  pOVar1 = Variable::operator->((Variable *)this);
  Callback::operator=((Callback *)pOVar1->data,&local_c8);
  puVar2 = extraout_RDX;
  if (local_c8.nsp.is_null == false) {
    __gnu_cxx::new_allocator<LiteScript::Namer>::destroy<LiteScript::Namer>
              (&local_c9,(Namer *)&local_c8.nsp);
    puVar2 = extraout_RDX_00;
  }
  local_c8.nsp.is_null = true;
  if (local_c8.This.is_null == false) {
    Variable::~Variable((Variable *)&local_c8.This);
    puVar2 = extraout_RDX_01;
  }
  VVar3.nb_ref = puVar2;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, Variable (* value)(State &, std::vector<Variable> &)) {
    Variable v = memory.Create(Type::CALLBACK);
    v->GetData<Callback>() = Callback(memory, value);
    return v;
}